

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boostdep.cpp
# Opt level: O0

void __thiscall module_subset_csv_actions::heading(module_subset_csv_actions *this,string *module)

{
  ostream *poVar1;
  string *module_local;
  module_subset_csv_actions *this_local;
  
  if (s_csv_table_marker) {
    poVar1 = std::operator<<((ostream *)&std::cout,"[Subset]");
    poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,(string *)module);
    std::operator<<(poVar1,"\n");
  }
  if ((s_csv_table_header & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Module");
    poVar1 = std::operator<<(poVar1,(string *)&s_csv_separator_abi_cxx11_);
    std::operator<<(poVar1,"Path\n");
  }
  return;
}

Assistant:

void heading( std::string const & module )
    {
        if( s_csv_table_marker )
            std::cout << "[Subset]" << s_csv_separator << module << "\n";
        if( s_csv_table_header )
            std::cout << "Module" << s_csv_separator << "Path\n";
    }